

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

UniValue *
wallet::ProcessImportLegacy
          (UniValue *__return_storage_ptr__,ImportData *import_data,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool *have_solving_data,UniValue *data,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_header *p_Var5;
  VType VVar6;
  pointer pcVar7;
  _Head_base<0UL,_CScript_*,_false> _Var8;
  CScript *pCVar9;
  undefined8 uVar10;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_00;
  CScript *pCVar11;
  iterator __position;
  bool bVar12;
  bool bVar13;
  char cVar14;
  UniValue *pUVar15;
  string *psVar16;
  string *psVar17;
  undefined7 extraout_var;
  optional<OutputType> oVar18;
  _Head_base<0UL,_CScript_*,_false> this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  const_iterator cVar19;
  const_iterator cVar20;
  _Base_ptr p_Var21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  _Base_ptr p_Var23;
  const_iterator cVar24;
  iterator iVar25;
  iterator iVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer __p;
  iterator __position_00;
  ScriptContext script_ctx;
  _Self __tmp_1;
  char cVar29;
  size_t sVar30;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  string_view str;
  string_view str_00;
  string_view str_01;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>_>
  pVar31;
  bool internal;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vData;
  CKeyID id;
  CScript script;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_1;
  undefined8 in_stack_fffffffffffff9d8;
  ImportData *this_01;
  undefined4 uVar32;
  undefined4 in_stack_fffffffffffffa04;
  map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_> *this_02;
  _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
  *this_03;
  undefined7 in_stack_fffffffffffffa20;
  _Alloc_hider in_stack_fffffffffffffa28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  UniValue local_5b8;
  UniValue local_560;
  UniValue local_508;
  UniValue local_4b0;
  undefined1 local_458 [16];
  undefined1 local_448 [48];
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
  local_418;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_3e8;
  UniValue local_3b0;
  UniValue local_358;
  UniValue local_300;
  undefined1 local_2a8 [8];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  CScript local_268;
  string local_248;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_1a8;
  string local_190;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<UniValue,_std::allocator<UniValue>_> vStack_130;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_03 = (_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
             *)script_pub_keys;
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"scriptPubKey","");
  pUVar15 = UniValue::operator[](data,(string *)local_458);
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  VVar6 = pUVar15->typ;
  if (VVar6 == VSTR) {
    bVar13 = false;
    bVar12 = false;
  }
  else {
    bVar12 = true;
    bVar13 = VVar6 == VOBJ;
    if (bVar13) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"address","");
      bVar12 = UniValue::findKey(pUVar15,&local_78,(size_t *)local_458);
      bVar12 = !bVar12;
    }
  }
  if ((bVar13) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2)) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (bVar12) {
    pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
    local_458._0_8_ = local_448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,
               "scriptPubKey must be string with script or JSON with address string","");
    JSONRPCError(pUVar15,-8,(string *)local_458);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_0029ad83;
  }
  if (VVar6 == VSTR) {
    psVar16 = UniValue::get_str_abi_cxx11_(pUVar15);
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"address","");
    pUVar15 = UniValue::operator[](pUVar15,&local_98);
    psVar16 = UniValue::get_str_abi_cxx11_(pUVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"redeemscript","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)local_170);
  if (bVar13) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"redeemscript","");
    pUVar15 = UniValue::operator[](data,&local_d8);
    psVar17 = UniValue::get_str_abi_cxx11_(pUVar15);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    pcVar7 = (psVar17->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar7,pcVar7 + psVar17->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"witnessscript","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)local_170);
  if (bVar13) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"witnessscript","");
    pUVar15 = UniValue::operator[](data,&local_118);
    psVar17 = UniValue::get_str_abi_cxx11_(pUVar15);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    pcVar7 = (psVar17->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar7,pcVar7 + psVar17->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"pubkeys","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)local_1e8);
  if (bVar13) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"pubkeys","");
    pUVar15 = UniValue::operator[](data,&local_190);
    pUVar15 = UniValue::get_array(pUVar15);
    local_170._0_4_ = pUVar15->typ;
    local_168._M_p = (pointer)&local_158;
    pcVar7 = (pUVar15->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar7,pcVar7 + (pUVar15->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_148,&pUVar15->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&vStack_130,&pUVar15->values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_168._M_p = (pointer)&local_158;
    local_160 = 0;
    local_158._M_local_buf[0] = '\0';
    local_170._0_4_ = VNULL;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_130.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_130.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_130.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"keys","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)&local_208);
  if (bVar13) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"keys","");
    pUVar15 = UniValue::operator[](data,&local_208);
    pUVar15 = UniValue::get_array(pUVar15);
    local_1e8._0_4_ = pUVar15->typ;
    local_1e0._M_p = (pointer)&local_1d0;
    pcVar7 = (pUVar15->val)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar7,pcVar7 + (pUVar15->val)._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,&pUVar15->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector(&vStack_1a8,&pUVar15->values);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_1e0._M_p = (pointer)&local_1d0;
    local_1d8 = 0;
    local_1d0._M_local_buf[0] = '\0';
    local_1e8._0_4_ = VNULL;
    local_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_1a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_1a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"internal","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)&local_228);
  if (bVar13) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"internal","");
    pUVar15 = UniValue::operator[](data,&local_228);
    cVar14 = UniValue::get_bool(pUVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cVar14 = false;
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"watchonly","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)&local_248);
  psVar17 = psVar16;
  if (bVar13) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"watchonly","");
    pUVar15 = UniValue::operator[](data,&local_248);
    bVar13 = UniValue::get_bool(pUVar15);
    uVar32 = (undefined4)CONCAT71(extraout_var,bVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    uVar32 = 0;
  }
  if ((undefined1 *)local_458._0_8_ != local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  local_458._0_8_ = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"range","");
  bVar13 = UniValue::findKey(data,(string *)local_458,(size_t *)(local_278 + 0x10));
  if ((CScript *)local_458._0_8_ != (CScript *)local_448) {
    operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
  }
  if (bVar13) {
    pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
    local_458._0_8_ = local_448;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,"Range should not be specified for a non-descriptor import","");
    JSONRPCError(pUVar15,-8,(string *)local_458);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_0029ad83;
  }
  local_268.super_CScriptBase._union._16_4_ = 0;
  local_268.super_CScriptBase._union._20_4_ = 0;
  local_268.super_CScriptBase._union._24_4_ = _S_red;
  local_268.super_CScriptBase._size = 0;
  local_268.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  local_268.super_CScriptBase._union.indirect_contents.capacity = 0;
  local_268.super_CScriptBase._union._12_4_ = 0;
  if (VVar6 == VSTR) {
    str._M_str = (psVar16->_M_dataplus)._M_p;
    str._M_len = psVar16->_M_string_length;
    bVar13 = IsHex(str);
    if (!bVar13) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     "Invalid scriptPubKey \"",psVar16);
      pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"\"");
      local_458._0_8_ = (pbVar22->_M_dataplus)._M_p;
      paVar27 = &pbVar22->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_448._8_4_ = (undefined4)uVar10;
        local_448._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_458._0_8_ = (CScript *)local_448;
      }
      else {
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_458._8_4_ = (undefined4)pbVar22->_M_string_length;
      local_458._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
      (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar22->_M_string_length = 0;
      (pbVar22->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar15,-5,(string *)local_458);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    hex_str._M_str = (psVar16->_M_dataplus)._M_p;
    hex_str._M_len = psVar16->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2a8,hex_str);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_458,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_2a8,local_2a0);
    if (0x1c < local_268.super_CScriptBase._size) {
      free(local_268.super_CScriptBase._union.indirect_contents.indirect);
    }
    local_268.super_CScriptBase._union._16_4_ = local_448._0_4_;
    local_268.super_CScriptBase._union._20_4_ = local_448._4_4_;
    local_268.super_CScriptBase._union._24_4_ = local_448._8_4_;
    local_268.super_CScriptBase._union.indirect_contents.indirect = (char *)local_458._0_8_;
    local_268.super_CScriptBase._union.indirect_contents.capacity = local_458._8_4_;
    local_268.super_CScriptBase._union._12_4_ = local_458._12_4_;
    local_268.super_CScriptBase._size = local_448._12_4_;
    local_448._0_4_ = 0;
    local_448._4_4_ = 0;
    local_448._8_4_ = _S_red;
    local_448._12_4_ = 0;
    local_458._0_8_ = (CScript *)0x0;
    local_458._8_4_ = 0;
    local_458._12_4_ = 0;
    local_418._M_impl.super__Rb_tree_header._M_header._M_color =
         local_418._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    bVar13 = ExtractDestination((CScript *)(local_278 + 0x10),(CTxDestination *)local_458);
    if ((!bVar13) && ((bool)cVar14 == false)) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      local_288._0_8_ = local_278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,
                 "Internal must be set to true for nonstandard scriptPubKey imports.","");
      JSONRPCError(pUVar15,-8,(string *)local_288);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_458);
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8,local_298._M_allocated_capacity - (long)local_2a8);
    }
  }
  else {
    DecodeDestination((CTxDestination *)local_458,psVar16);
    bVar13 = IsValidDestination((CTxDestination *)local_458);
    if (!bVar13) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     "Invalid address \"",psVar16);
      pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,"\"");
      local_288._0_8_ = (pbVar22->_M_dataplus)._M_p;
      paVar27 = &pbVar22->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
        local_278._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_278._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_278._8_4_ = (undefined4)uVar10;
        local_278._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_288._0_8_ = (CScript *)local_278;
      }
      else {
        local_278._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_278._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_288._8_4_ = (undefined4)pbVar22->_M_string_length;
      local_288._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
      (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar22->_M_string_length = 0;
      (pbVar22->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar15,-5,(string *)local_288);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    oVar18 = OutputTypeFromDestination((CTxDestination *)local_458);
    if (((ulong)oVar18.super__Optional_base<OutputType,_true,_true>._M_payload.
                super__Optional_payload_base<OutputType> & 0x1ffffffff) == 0x100000003) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      local_288._0_8_ = local_278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,"Bech32m addresses cannot be imported into legacy wallets","");
      JSONRPCError(pUVar15,-5,(string *)local_288);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    GetScriptForDestination((CScript *)local_288,(CTxDestination *)local_458);
    if (0x1c < local_268.super_CScriptBase._size) {
      free(local_268.super_CScriptBase._union.indirect_contents.indirect);
    }
    local_268.super_CScriptBase._union._16_4_ = local_278._0_4_;
    local_268.super_CScriptBase._union._20_4_ = local_278._4_4_;
    local_268.super_CScriptBase._union._24_4_ = local_278._8_4_;
    local_268.super_CScriptBase._union.indirect_contents.indirect = (char *)local_288._0_8_;
    local_268.super_CScriptBase._union.indirect_contents.capacity = local_288._8_4_;
    local_268.super_CScriptBase._union._12_4_ = local_288._12_4_;
    local_268.super_CScriptBase._size = local_278._12_4_;
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_458);
  }
  std::_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
  ::_M_emplace_unique<CScript&>(this_03,(CScript *)(local_278 + 0x10));
  if (local_b8._M_string_length != 0) {
    str_00._M_str = local_b8._M_dataplus._M_p;
    str_00._M_len = local_b8._M_string_length;
    bVar13 = IsHex(str_00);
    if (!bVar13) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     "Invalid redeem script \"",&local_b8);
      pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"\": must be hex string");
      local_458._0_8_ = (pbVar22->_M_dataplus)._M_p;
      paVar27 = &pbVar22->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_448._8_4_ = (undefined4)uVar10;
        local_448._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_458._0_8_ = (CScript *)local_448;
      }
      else {
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_458._8_4_ = (undefined4)pbVar22->_M_string_length;
      local_458._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
      (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar22->_M_string_length = 0;
      (pbVar22->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar15,-5,(string *)local_458);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    hex_str_00._M_str = local_b8._M_dataplus._M_p;
    hex_str_00._M_len = local_b8._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_458,hex_str_00);
    uVar10 = local_458._0_8_;
    last._M_current._4_4_ = local_458._12_4_;
    last._M_current._0_4_ = local_458._8_4_;
    this._M_head_impl = (CScript *)operator_new(0x20);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this._M_head_impl,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )uVar10,last);
    local_288._0_8_ = (CScript *)0x0;
    _Var8._M_head_impl =
         (import_data->redeemscript)._M_t.
         super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
         super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
         super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
    (import_data->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
    _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl = this._M_head_impl;
    if (_Var8._M_head_impl != (CScript *)0x0) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)import_data,_Var8._M_head_impl);
    }
    if ((CScript *)local_288._0_8_ != (CScript *)0x0) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)local_288,(CScript *)local_288._0_8_);
    }
    if ((CScript *)local_458._0_8_ != (CScript *)0x0) {
      operator_delete((void *)local_458._0_8_,
                      CONCAT44(local_448._4_4_,local_448._0_4_) - local_458._0_8_);
    }
  }
  if (local_f8._M_string_length != 0) {
    str_01._M_str = local_f8._M_dataplus._M_p;
    str_01._M_len = local_f8._M_string_length;
    bVar13 = IsHex(str_01);
    if (!bVar13) {
      pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     "Invalid witness script \"",&local_f8);
      pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"\": must be hex string");
      local_458._0_8_ = (pbVar22->_M_dataplus)._M_p;
      paVar27 = &pbVar22->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_448._8_4_ = (undefined4)uVar10;
        local_448._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_458._0_8_ = (CScript *)local_448;
      }
      else {
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_458._8_4_ = (undefined4)pbVar22->_M_string_length;
      local_458._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
      (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar22->_M_string_length = 0;
      (pbVar22->field_2)._M_local_buf[0] = '\0';
      JSONRPCError(pUVar15,-5,(string *)local_458);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0029ad83;
    }
    hex_str_01._M_str = local_f8._M_dataplus._M_p;
    hex_str_01._M_len = local_f8._M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_458,hex_str_01);
    uVar10 = local_458._0_8_;
    last_00._M_current._4_4_ = local_458._12_4_;
    last_00._M_current._0_4_ = local_458._8_4_;
    this_00 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)operator_new(0x20);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::
    prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              (this_00,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )uVar10,last_00);
    local_288._0_8_ = (CScript *)0x0;
    pCVar9 = (import_data->witnessscript)._M_t.
             super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
             super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
             super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
    (import_data->witnessscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
    _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
    super__Head_base<0UL,_CScript_*,_false>._M_head_impl = (CScript *)this_00;
    if (pCVar9 != (CScript *)0x0) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)&import_data->witnessscript,pCVar9);
    }
    if ((CScript *)local_288._0_8_ != (CScript *)0x0) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)local_288,(CScript *)local_288._0_8_);
    }
    if ((CScript *)local_458._0_8_ != (CScript *)0x0) {
      operator_delete((void *)local_458._0_8_,
                      CONCAT44(local_448._4_4_,local_448._0_4_) - local_458._0_8_);
    }
  }
  if (vStack_130.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vStack_130.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar30 = 0;
    do {
      pUVar15 = UniValue::operator[]((UniValue *)local_170,sVar30);
      psVar16 = UniValue::get_str_abi_cxx11_(pUVar15);
      HexToPubKey((CPubKey *)local_458,psVar16);
      CPubKey::GetID((CKeyID *)local_288,(CPubKey *)local_458);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)pubkey_map,(CKeyID *)local_288,(CPubKey *)local_458);
      CPubKey::GetID((CKeyID *)local_288,(CPubKey *)local_458);
      std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>::
      emplace_back<CKeyID,bool_const&>
                ((vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>> *)
                 ordered_pubkeys,(CKeyID *)local_288,(bool *)&stack0xfffffffffffffa27);
      sVar30 = sVar30 + 1;
    } while (sVar30 < (ulong)(((long)vStack_130.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)vStack_130.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  script_ctx = (ScriptContext)script_pub_keys;
  if (vStack_1a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vStack_1a8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
    sVar30 = 0;
    do {
      pUVar15 = UniValue::operator[]((UniValue *)local_1e8,sVar30);
      UniValue::get_str_abi_cxx11_(pUVar15);
      DecodeSecret((string *)local_2a8);
      if ((array<unsigned_char,_32UL> *)local_2a0._M_current == (array<unsigned_char,_32UL> *)0x0) {
        pUVar15 = (UniValue *)__cxa_allocate_exception(0x58);
        local_458._0_8_ = local_448;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_458,"Invalid private key encoding","");
        JSONRPCError(pUVar15,-5,(string *)local_458);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar15,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0029ad83;
      }
      CKey::GetPubKey((CPubKey *)local_458,(CKey *)local_2a8);
      CPubKey::GetID((CKeyID *)local_288,(CPubKey *)local_458);
      cVar19 = std::
               _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
               ::find(&pubkey_map->_M_t,(CKeyID *)local_288);
      if (cVar19._M_node != p_Var1) {
        pVar31 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                 ::equal_range(&pubkey_map->_M_t,(CKeyID *)local_288);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::_M_erase_aux(&pubkey_map->_M_t,(_Base_ptr)pVar31.first._M_node,
                       (_Base_ptr)pVar31.second._M_node);
      }
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
      ::_M_emplace_unique<CKeyID&,CKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                  *)privkey_map,(CKeyID *)local_288,(CKey *)local_2a8);
      if ((array<unsigned_char,_32UL> *)local_2a0._M_current != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_2a0,
                   (array<unsigned_char,_32UL> *)local_2a0._M_current);
      }
      script_ctx = (ScriptContext)script_pub_keys;
      sVar30 = sVar30 + 1;
    } while (sVar30 < (ulong)(((long)vStack_1a8.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)vStack_1a8.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3));
  }
  if ((((import_data->redeemscript)._M_t.
        super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
        super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
        super__Head_base<0UL,_CScript_*,_false>._M_head_impl == (CScript *)0x0) &&
      ((import_data->witnessscript)._M_t.
       super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
       super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
       super__Head_base<0UL,_CScript_*,_false>._M_head_impl == (CScript *)0x0)) &&
     (*(size_t *)((long)pubkey_map + 0x28) == 0)) {
    sVar30 = *(size_t *)((long)privkey_map + 0x28);
    *have_solving_data = sVar30 != 0;
    if (sVar30 != 0) goto LAB_0029933c;
  }
  else {
    *have_solving_data = true;
LAB_0029933c:
    this_01 = import_data;
    RecurseImportData_abi_cxx11_
              ((string *)local_288,(wallet *)(local_278 + 0x10),(CScript *)import_data,
               (ImportData *)0x0,script_ctx);
    p_Var21 = (import_data->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(import_data->used_keys)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 != p_Var2) {
      p_Var1 = (_Base_ptr)((long)privkey_map + 8);
      do {
        local_448._0_4_ = *(undefined4 *)&p_Var21[1]._M_left;
        local_458._0_8_ = *(undefined8 *)(p_Var21 + 1);
        local_458._8_4_ = SUB84(p_Var21[1]._M_parent,0);
        local_458._12_4_ = (undefined4)((ulong)p_Var21[1]._M_parent >> 0x20);
        local_448[4] = *(undefined1 *)((long)&p_Var21[1]._M_left + 4);
        cVar20 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 ::find(&privkey_map->_M_t,(key_type *)local_458);
        if (cVar20._M_node == p_Var1) break;
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var2);
    }
    cVar29 = (char)uVar32;
    if ((_Rb_tree_header *)p_Var21 != p_Var2 && cVar29 == '\0') {
      UniValue::UniValue<const_char_(&)[121],_char[121],_true>
                (&local_300,
                 (char (*) [121])
                 "Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag."
                );
      val.val._M_dataplus._M_p = (pointer)pubkey_map;
      val._0_8_ = in_stack_fffffffffffff9d8;
      val.val._M_string_length = (size_type)this_01;
      val.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
      val.val.field_2._8_8_ = privkey_map;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar32;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffa04;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_03;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
      UniValue::push_back(__return_storage_ptr__,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_300.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_300.keys);
      cVar29 = (char)uVar32;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.val._M_dataplus._M_p != &local_300.val.field_2) {
        operator_delete(local_300.val._M_dataplus._M_p,
                        local_300.val.field_2._M_allocated_capacity + 1);
      }
    }
    if (cVar29 == '\x01' && (_Rb_tree_header *)p_Var21 == p_Var2) {
      UniValue::UniValue<const_char_(&)[128],_char[128],_true>
                (&local_358,
                 (char (*) [128])
                 "All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag."
                );
      val_00.val._M_dataplus._M_p = (pointer)pubkey_map;
      val_00._0_8_ = in_stack_fffffffffffff9d8;
      val_00.val._M_string_length = (size_type)this_01;
      val_00.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
      val_00.val.field_2._8_8_ = privkey_map;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar32;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffffa04;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_03;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
      UniValue::push_back(__return_storage_ptr__,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_358.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358.val._M_dataplus._M_p != &local_358.val.field_2) {
        operator_delete(local_358.val._M_dataplus._M_p,
                        local_358.val.field_2._M_allocated_capacity + 1);
      }
    }
    if ((CONCAT44(local_288._12_4_,local_288._8_4_) == 0) &&
       (p_Var21 = (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
       (_Rb_tree_header *)p_Var21 != p_Var2)) {
      p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
      p_Var3 = (_Base_ptr)((long)privkey_map + 8);
      do {
        if (*(char *)((long)&p_Var21[1]._M_left + 4) == '\x01') {
          cVar19 = std::
                   _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   ::find(&pubkey_map->_M_t,(key_type *)(p_Var21 + 1));
          if ((cVar19._M_node == p_Var1) &&
             (cVar20 = std::
                       _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                       ::find(&privkey_map->_M_t,(key_type *)(p_Var21 + 1)),
             cVar20._M_node == p_Var3)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,0,CONCAT44(local_288._12_4_,local_288._8_4_),
                       "some required keys are missing",0x1e);
          }
        }
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var2);
    }
    this_02 = &this_01->used_keys;
    if (CONCAT44(local_288._12_4_,local_288._8_4_) == 0) {
      if ((this_01->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>
          ._M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
          super__Head_base<0UL,_CScript_*,_false>._M_head_impl != (CScript *)0x0) {
        UniValue::UniValue<const_char_(&)[52],_char[52],_true>
                  (&local_4b0,(char (*) [52])"Ignoring redeemscript as this is not a P2SH script.");
        val_01.val._M_dataplus._M_p = (pointer)pubkey_map;
        val_01._0_8_ = in_stack_fffffffffffff9d8;
        val_01.val._M_string_length = (size_type)this_01;
        val_01.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
        val_01.val.field_2._8_8_ = privkey_map;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
        val_01.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this_03;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
        val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
        UniValue::push_back(__return_storage_ptr__,val_01);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4b0.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4b0.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0.val._M_dataplus._M_p != &local_4b0.val.field_2) {
          operator_delete(local_4b0.val._M_dataplus._M_p,
                          local_4b0.val.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this_01->witnessscript)._M_t.
          super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
          super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
          super__Head_base<0UL,_CScript_*,_false>._M_head_impl != (CScript *)0x0) {
        UniValue::UniValue<const_char_(&)[61],_char[61],_true>
                  (&local_508,
                   (char (*) [61])"Ignoring witnessscript as this is not a (P2SH-)P2WSH script.");
        val_02.val._M_dataplus._M_p = (pointer)pubkey_map;
        val_02._0_8_ = in_stack_fffffffffffff9d8;
        val_02.val._M_string_length = (size_type)this_01;
        val_02.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
        val_02.val.field_2._8_8_ = privkey_map;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
        val_02.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this_03;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
        val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
        UniValue::push_back(__return_storage_ptr__,val_02);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_508.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_508.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508.val._M_dataplus._M_p != &local_508.val.field_2) {
          operator_delete(local_508.val._M_dataplus._M_p,
                          local_508.val.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var21 = (_Base_ptr)((long)privkey_map + 8);
      if (*(_Base_ptr *)((long)privkey_map + 0x18) != p_Var21) {
        __position_00._M_node = *(_Base_ptr *)((long)privkey_map + 0x18);
        do {
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)__position_00._M_node);
          cVar24 = std::
                   _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                   ::find(&this_02->_M_t,__position_00._M_node + 1);
          if ((_Rb_tree_header *)cVar24._M_node == p_Var2) {
            UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                      (&local_560,(char (*) [33])"Ignoring irrelevant private key.");
            val_03.val._M_dataplus._M_p = (pointer)pubkey_map;
            val_03._0_8_ = in_stack_fffffffffffff9d8;
            val_03.val._M_string_length = (size_type)this_01;
            val_03.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
            val_03.val.field_2._8_8_ = privkey_map;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
            val_03.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)this_03;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
            val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
            UniValue::push_back(__return_storage_ptr__,val_03);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560.values);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_560.keys);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_560.val._M_dataplus._M_p != &local_560.val.field_2) {
              operator_delete(local_560.val._M_dataplus._M_p,
                              local_560.val.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
            ::erase_abi_cxx11_((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                                *)privkey_map,__position_00);
          }
          __position_00._M_node = p_Var23;
        } while (p_Var23 != p_Var21);
      }
      p_Var1 = (_Base_ptr)((long)pubkey_map + 8);
      iVar25._M_node = *(_Base_ptr *)((long)pubkey_map + 0x18);
      while (__position._M_node = iVar25._M_node, __position._M_node != p_Var1) {
        iVar25._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        iVar26 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                 ::find(&this_02->_M_t,__position._M_node + 1);
        if (((_Rb_tree_header *)iVar26._M_node == p_Var2) ||
           (*(char *)((long)&iVar26._M_node[1]._M_left + 4) == '\0')) {
          s.m_size = 0x14;
          s.m_data = (uchar *)(__position._M_node + 1);
          HexStr_abi_cxx11_((string *)&stack0xfffffffffffffa28,s);
          pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((string *)&stack0xfffffffffffffa28,0,0,"Ignoring public key \"",0x15);
          local_2a8 = (undefined1  [8])&local_298;
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar22->_M_dataplus)._M_p;
          paVar28 = &pbVar22->field_2;
          if (paVar27 == paVar28) {
            local_298._M_allocated_capacity = paVar28->_M_allocated_capacity;
            local_298._8_8_ = *(undefined8 *)((long)&pbVar22->field_2 + 8);
          }
          else {
            local_298._M_allocated_capacity = paVar28->_M_allocated_capacity;
            local_2a8 = (undefined1  [8])paVar27;
          }
          local_2a0._M_current = (uchar *)pbVar22->_M_string_length;
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar28;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2a8,"\" as it doesn\'t appear inside P2PKH or P2WPKH.");
          local_458._0_8_ = local_448;
          pCVar9 = (CScript *)(pbVar22->_M_dataplus)._M_p;
          paVar27 = &pbVar22->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pCVar9 == paVar27) {
            uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
            local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
            local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
            local_448._8_4_ = (undefined4)uVar10;
            local_448._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
          }
          else {
            local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
            local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
            local_458._0_8_ = pCVar9;
          }
          local_458._8_4_ = (undefined4)pbVar22->_M_string_length;
          local_458._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
          (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
          pbVar22->_M_string_length = 0;
          (pbVar22->field_2)._M_local_buf[0] = '\0';
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_5b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458)
          ;
          val_04.val._M_dataplus._M_p = (pointer)pubkey_map;
          val_04._0_8_ = in_stack_fffffffffffff9d8;
          val_04.val._M_string_length = (size_type)this_01;
          val_04.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
          val_04.val.field_2._8_8_ = privkey_map;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
          val_04.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this_03;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
          val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
          UniValue::push_back(__return_storage_ptr__,val_04);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5b8.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5b8.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5b8.val._M_dataplus._M_p != &local_5b8.val.field_2) {
            operator_delete(local_5b8.val._M_dataplus._M_p,
                            local_5b8.val.field_2._M_allocated_capacity + 1);
          }
          if ((CScript *)local_458._0_8_ != (CScript *)local_448) {
            operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
          }
          if (local_2a8 != (undefined1  [8])&local_298) {
            operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffa28._M_p != &local_5c8) {
            operator_delete(in_stack_fffffffffffffa28._M_p,local_5c8._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
          ::erase_abi_cxx11_((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                              *)pubkey_map,__position);
        }
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     "Importing as non-solvable: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      pbVar22 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a8,
                       ". If this is intentional, don\'t provide any keys, pubkeys, witnessscript, or redeemscript."
                      );
      local_458._0_8_ = (pbVar22->_M_dataplus)._M_p;
      paVar27 = &pbVar22->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ == paVar27) {
        uVar10 = *(undefined8 *)((long)&pbVar22->field_2 + 8);
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
        local_448._8_4_ = (undefined4)uVar10;
        local_448._12_4_ = (undefined4)((ulong)uVar10 >> 0x20);
        local_458._0_8_ = (CScript *)local_448;
      }
      else {
        local_448._0_4_ = (undefined4)paVar27->_M_allocated_capacity;
        local_448._4_4_ = (undefined4)(paVar27->_M_allocated_capacity >> 0x20);
      }
      local_458._8_4_ = (undefined4)pbVar22->_M_string_length;
      local_458._12_4_ = (undefined4)(pbVar22->_M_string_length >> 0x20);
      (pbVar22->_M_dataplus)._M_p = (pointer)paVar27;
      pbVar22->_M_string_length = 0;
      (pbVar22->field_2)._M_local_buf[0] = '\0';
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
      val_05.val._M_dataplus._M_p = (pointer)pubkey_map;
      val_05._0_8_ = in_stack_fffffffffffff9d8;
      val_05.val._M_string_length = (size_type)this_01;
      val_05.val.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
      val_05.val.field_2._8_8_ = privkey_map;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)this_02;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)((ulong)this_02 >> 0x20);
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)have_solving_data;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_03;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffa20;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = (bool)cVar14;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffa28._M_p;
      UniValue::push_back(__return_storage_ptr__,val_05);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3b0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3b0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.val._M_dataplus._M_p != &local_3b0.val.field_2) {
        operator_delete(local_3b0.val._M_dataplus._M_p,
                        local_3b0.val.field_2._M_allocated_capacity + 1);
      }
      if ((CScript *)local_458._0_8_ != (CScript *)local_448) {
        operator_delete((void *)local_458._0_8_,CONCAT44(local_448._4_4_,local_448._0_4_) + 1);
      }
      if (local_2a8 != (undefined1  [8])&local_298) {
        operator_delete((void *)local_2a8,(ulong)(local_298._M_allocated_capacity + 1));
      }
      p_Var21 = (_Base_ptr)(local_448 + 8);
      memset(local_458,0,0xa0);
      uVar10 = local_458._0_8_;
      local_448._40_8_ = 0;
      p_Var4 = &local_418._M_impl.super__Rb_tree_header;
      local_418._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_418._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_418._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var5 = &local_3e8._M_impl.super__Rb_tree_header;
      local_3e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_458._0_8_ = (CScript *)0x0;
      _Var8._M_head_impl =
           (this_01->redeemscript)._M_t.
           super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
           super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
           super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
      (this_01->redeemscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
      _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
      super__Head_base<0UL,_CScript_*,_false>._M_head_impl = (CScript *)uVar10;
      local_448._24_8_ = p_Var21;
      local_448._32_8_ = p_Var21;
      local_418._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      local_418._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      local_3e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      local_3e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      if (_Var8._M_head_impl != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)this_01,_Var8._M_head_impl);
      }
      pCVar11 = (CScript *)CONCAT44(local_458._12_4_,local_458._8_4_);
      local_458._8_4_ = 0;
      local_458._12_4_ = 0;
      pCVar9 = (this_01->witnessscript)._M_t.
               super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>._M_t.
               super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
               super__Head_base<0UL,_CScript_*,_false>._M_head_impl;
      (this_01->witnessscript)._M_t.super___uniq_ptr_impl<CScript,_std::default_delete<CScript>_>.
      _M_t.super__Tuple_impl<0UL,_CScript_*,_std::default_delete<CScript>_>.
      super__Head_base<0UL,_CScript_*,_false>._M_head_impl = pCVar11;
      if (pCVar9 != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)&this_01->witnessscript,pCVar9);
      }
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::clear(&(this_01->import_scripts)._M_t);
      if ((_Base_ptr)local_448._16_8_ != (_Base_ptr)0x0) {
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_448._8_4_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_448._16_8_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_448._24_8_;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)local_448._32_8_;
        *(_Rb_tree_header **)(local_448._16_8_ + 8) =
             &(this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header;
        (this_01->import_scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_448._40_8_;
        local_448._16_8_ = (_Base_ptr)0x0;
        local_448._40_8_ = 0;
        local_448._24_8_ = p_Var21;
        local_448._32_8_ = p_Var21;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
      ::clear(&this_02->_M_t);
      if (local_418._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_418._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_418._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_418._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_418._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_418._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var2->_M_header;
        (this_01->used_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_418._M_impl.super__Rb_tree_header._M_node_count;
        local_418._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_418._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_418._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
        local_418._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::clear(&(this_01->key_origins)._M_t);
      if (local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_3e8._M_impl.super__Rb_tree_header._M_header._M_color;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_3e8._M_impl.super__Rb_tree_header._M_header._M_left;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_3e8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_header;
        (this_01->key_origins)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             local_3e8._M_impl.super__Rb_tree_header._M_node_count;
        local_3e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_3e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_3e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
        local_3e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
      ::~_Rb_tree(&local_3e8);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_bool>,_std::_Select1st<std::pair<const_CKeyID,_bool>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
      ::~_Rb_tree(&local_418);
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::~_Rb_tree((_Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
                   *)local_448);
      if ((CScript *)CONCAT44(local_458._12_4_,local_458._8_4_) != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)(local_458 + 8),
                   (CScript *)CONCAT44(local_458._12_4_,local_458._8_4_));
      }
      local_458._8_4_ = 0;
      local_458._12_4_ = 0;
      if ((CScript *)local_458._0_8_ != (CScript *)0x0) {
        std::default_delete<CScript>::operator()
                  ((default_delete<CScript> *)local_458,(CScript *)local_458._0_8_);
      }
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
      ::clear(&pubkey_map->_M_t);
      std::
      _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
      ::clear(&privkey_map->_M_t);
      *have_solving_data = false;
    }
    if ((CScript *)local_288._0_8_ != (CScript *)local_278) {
      operator_delete((void *)local_288._0_8_,CONCAT44(local_278._4_4_,local_278._0_4_) + 1);
    }
  }
  if (0x1c < local_268.super_CScriptBase._size) {
    free(local_268.super_CScriptBase._union.indirect_contents.indirect);
    local_268.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_1a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p,
                    CONCAT71(local_1d0._M_allocated_capacity._1_7_,local_1d0._M_local_buf[0]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0029ad83:
  __stack_chk_fail();
}

Assistant:

static UniValue ProcessImportLegacy(ImportData& import_data, std::map<CKeyID, CPubKey>& pubkey_map, std::map<CKeyID, CKey>& privkey_map, std::set<CScript>& script_pub_keys, bool& have_solving_data, const UniValue& data, std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys)
{
    UniValue warnings(UniValue::VARR);

    // First ensure scriptPubKey has either a script or JSON with "address" string
    const UniValue& scriptPubKey = data["scriptPubKey"];
    bool isScript = scriptPubKey.getType() == UniValue::VSTR;
    if (!isScript && !(scriptPubKey.getType() == UniValue::VOBJ && scriptPubKey.exists("address"))) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "scriptPubKey must be string with script or JSON with address string");
    }
    const std::string& output = isScript ? scriptPubKey.get_str() : scriptPubKey["address"].get_str();

    // Optional fields.
    const std::string& strRedeemScript = data.exists("redeemscript") ? data["redeemscript"].get_str() : "";
    const std::string& witness_script_hex = data.exists("witnessscript") ? data["witnessscript"].get_str() : "";
    const UniValue& pubKeys = data.exists("pubkeys") ? data["pubkeys"].get_array() : UniValue();
    const UniValue& keys = data.exists("keys") ? data["keys"].get_array() : UniValue();
    const bool internal = data.exists("internal") ? data["internal"].get_bool() : false;
    const bool watchOnly = data.exists("watchonly") ? data["watchonly"].get_bool() : false;

    if (data.exists("range")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for a non-descriptor import");
    }

    // Generate the script and destination for the scriptPubKey provided
    CScript script;
    if (!isScript) {
        CTxDestination dest = DecodeDestination(output);
        if (!IsValidDestination(dest)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address \"" + output + "\"");
        }
        if (OutputTypeFromDestination(dest) == OutputType::BECH32M) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Bech32m addresses cannot be imported into legacy wallets");
        }
        script = GetScriptForDestination(dest);
    } else {
        if (!IsHex(output)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid scriptPubKey \"" + output + "\"");
        }
        std::vector<unsigned char> vData(ParseHex(output));
        script = CScript(vData.begin(), vData.end());
        CTxDestination dest;
        if (!ExtractDestination(script, dest) && !internal) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Internal must be set to true for nonstandard scriptPubKey imports.");
        }
    }
    script_pub_keys.emplace(script);

    // Parse all arguments
    if (strRedeemScript.size()) {
        if (!IsHex(strRedeemScript)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid redeem script \"" + strRedeemScript + "\": must be hex string");
        }
        auto parsed_redeemscript = ParseHex(strRedeemScript);
        import_data.redeemscript = std::make_unique<CScript>(parsed_redeemscript.begin(), parsed_redeemscript.end());
    }
    if (witness_script_hex.size()) {
        if (!IsHex(witness_script_hex)) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid witness script \"" + witness_script_hex + "\": must be hex string");
        }
        auto parsed_witnessscript = ParseHex(witness_script_hex);
        import_data.witnessscript = std::make_unique<CScript>(parsed_witnessscript.begin(), parsed_witnessscript.end());
    }
    for (size_t i = 0; i < pubKeys.size(); ++i) {
        CPubKey pubkey = HexToPubKey(pubKeys[i].get_str());
        pubkey_map.emplace(pubkey.GetID(), pubkey);
        ordered_pubkeys.emplace_back(pubkey.GetID(), internal);
    }
    for (size_t i = 0; i < keys.size(); ++i) {
        const auto& str = keys[i].get_str();
        CKey key = DecodeSecret(str);
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");
        }
        CPubKey pubkey = key.GetPubKey();
        CKeyID id = pubkey.GetID();
        if (pubkey_map.count(id)) {
            pubkey_map.erase(id);
        }
        privkey_map.emplace(id, key);
    }


    // Verify and process input data
    have_solving_data = import_data.redeemscript || import_data.witnessscript || pubkey_map.size() || privkey_map.size();
    if (have_solving_data) {
        // Match up data in import_data with the scriptPubKey in script.
        auto error = RecurseImportData(script, import_data, ScriptContext::TOP);

        // Verify whether the watchonly option corresponds to the availability of private keys.
        bool spendable = std::all_of(import_data.used_keys.begin(), import_data.used_keys.end(), [&](const std::pair<CKeyID, bool>& used_key){ return privkey_map.count(used_key.first) > 0; });
        if (!watchOnly && !spendable) {
            warnings.push_back("Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag.");
        }
        if (watchOnly && spendable) {
            warnings.push_back("All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag.");
        }

        // Check that all required keys for solvability are provided.
        if (error.empty()) {
            for (const auto& require_key : import_data.used_keys) {
                if (!require_key.second) continue; // Not a required key
                if (pubkey_map.count(require_key.first) == 0 && privkey_map.count(require_key.first) == 0) {
                    error = "some required keys are missing";
                }
            }
        }

        if (!error.empty()) {
            warnings.push_back("Importing as non-solvable: " + error + ". If this is intentional, don't provide any keys, pubkeys, witnessscript, or redeemscript.");
            import_data = ImportData();
            pubkey_map.clear();
            privkey_map.clear();
            have_solving_data = false;
        } else {
            // RecurseImportData() removes any relevant redeemscript/witnessscript from import_data, so we can use that to discover if a superfluous one was provided.
            if (import_data.redeemscript) warnings.push_back("Ignoring redeemscript as this is not a P2SH script.");
            if (import_data.witnessscript) warnings.push_back("Ignoring witnessscript as this is not a (P2SH-)P2WSH script.");
            for (auto it = privkey_map.begin(); it != privkey_map.end(); ) {
                auto oldit = it++;
                if (import_data.used_keys.count(oldit->first) == 0) {
                    warnings.push_back("Ignoring irrelevant private key.");
                    privkey_map.erase(oldit);
                }
            }
            for (auto it = pubkey_map.begin(); it != pubkey_map.end(); ) {
                auto oldit = it++;
                auto key_data_it = import_data.used_keys.find(oldit->first);
                if (key_data_it == import_data.used_keys.end() || !key_data_it->second) {
                    warnings.push_back("Ignoring public key \"" + HexStr(oldit->first) + "\" as it doesn't appear inside P2PKH or P2WPKH.");
                    pubkey_map.erase(oldit);
                }
            }
        }
    }

    return warnings;
}